

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O0

bool witness(int a,int n)

{
  long local_30;
  int64_t curr;
  int64_t prev;
  int i;
  int u;
  int t;
  int n_local;
  int a_local;
  
  i = 1;
  for (prev._4_4_ = n / 2; (prev._4_4_ & 1) == 0; prev._4_4_ = (int)prev._4_4_ / 2) {
    i = i + 1;
  }
  curr = power(a,prev._4_4_,n);
  prev._0_4_ = 1;
  while( true ) {
    if (i < (int)prev) {
      return local_30 != 1;
    }
    local_30 = (curr * curr) % (long)n;
    if (((local_30 == 1) && (curr != 1)) && (curr != n + -1)) break;
    prev._0_4_ = (int)prev + 1;
    curr = local_30;
  }
  return true;
}

Assistant:

bool witness(int a, int n)
{
	int t, u, i;
	int64_t prev, curr;

	u = n / 2;
	t = 1;
	while (!(u & 1))
	{
		u /= 2;
		++t;
	}

	prev = power(a, u, n);
	for (i = 1; i <= t; ++i)
	{
		curr = (prev*prev) % n;
		if ((curr == 1) && (prev != 1) && (prev != n - 1))
			return true;
		prev = curr;
	}
	if (curr != 1)
		return true;
	return false;
}